

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

void __thiscall
snappy::SnappyDecompressor::DecompressAllTags<snappy::SnappyDecompressionValidator>
          (SnappyDecompressor *this,SnappyDecompressionValidator *writer)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  ulong in_RAX;
  uint *puVar5;
  byte *pbVar6;
  ulong uVar7;
  undefined4 extraout_var;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  size_t n;
  ulong local_38;
  
  pbVar6 = (byte *)this->ip_;
  local_38 = in_RAX;
  if ((long)this->ip_limit_ - (long)pbVar6 < 5) {
    bVar3 = RefillTag(this);
    if (!bVar3) {
      return;
    }
    pbVar6 = (byte *)this->ip_;
  }
  do {
    bVar1 = *pbVar6;
    puVar5 = (uint *)(pbVar6 + 1);
    if ((bVar1 & 3) == 0) {
      uVar10 = (ulong)(bVar1 >> 2) + 1;
      if (0xec < bVar1) {
        uVar10 = (ulong)((*(uint *)(char_table + uVar10 * 4 + 0x110) & *puVar5) + 1);
        puVar5 = (uint *)((long)puVar5 + ((ulong)(bVar1 >> 2) - 0x3b));
      }
      pbVar8 = (byte *)this->ip_limit_;
      uVar9 = (long)pbVar8 - (long)puVar5;
      if ((ulong)((long)pbVar8 - (long)puVar5) < uVar10) {
        do {
          uVar7 = writer->produced_ + uVar9;
          writer->produced_ = uVar7;
          if (writer->expected_ < uVar7) {
            return;
          }
          (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
          iVar4 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
          puVar5 = (uint *)CONCAT44(extraout_var,iVar4);
          this->peeked_ = (uint32)local_38;
          if (local_38 == 0) {
            return;
          }
          uVar10 = uVar10 - uVar9;
          pbVar8 = (byte *)((long)puVar5 + local_38);
          this->ip_limit_ = (char *)pbVar8;
          uVar9 = local_38;
        } while (local_38 < uVar10);
      }
      uVar9 = writer->produced_ + uVar10;
      writer->produced_ = uVar9;
      if (writer->expected_ < uVar9) {
        return;
      }
      pbVar6 = (byte *)((long)puVar5 + uVar10);
    }
    else {
      uVar2 = *(ushort *)(char_table + (ulong)bVar1 * 2);
      if (writer->produced_ <=
          (ulong)((uVar2 & 0x700) + (*(uint *)(wordmask + (ulong)(uVar2 >> 0xb) * 4) & *puVar5)) - 1
         ) {
        return;
      }
      uVar10 = writer->produced_ + (ulong)(uVar2 & 0xff);
      writer->produced_ = uVar10;
      if (writer->expected_ < uVar10) {
        return;
      }
      pbVar6 = (byte *)((long)puVar5 + (ulong)(uVar2 >> 0xb));
      pbVar8 = (byte *)this->ip_limit_;
    }
    if ((long)pbVar8 - (long)pbVar6 < 5) {
      this->ip_ = (char *)pbVar6;
      bVar3 = RefillTag(this);
      pbVar6 = (byte *)this->ip_;
      if (!bVar3) {
        return;
      }
    }
  } while( true );
}

Assistant:

void DecompressAllTags(Writer* writer) {
    const char* ip = ip_;

    // We could have put this refill fragment only at the beginning of the loop.
    // However, duplicating it at the end of each branch gives the compiler more
    // scope to optimize the <ip_limit_ - ip> expression based on the local
    // context, which overall increases speed.
    #define MAYBE_REFILL() \
        if (ip_limit_ - ip < kMaximumTagLength) { \
          ip_ = ip; \
          if (!RefillTag()) return; \
          ip = ip_; \
        }

    MAYBE_REFILL();
    for ( ;; ) {
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip++));

      if ((c & 0x3) == LITERAL) {
        size_t literal_length = (c >> 2) + 1u;
        if (writer->TryFastAppend(ip, ip_limit_ - ip, literal_length)) {
          assert(literal_length < 61);
          ip += literal_length;
          // NOTE(user): There is no MAYBE_REFILL() here, as TryFastAppend()
          // will not return true unless there's already at least five spare
          // bytes in addition to the literal.
          continue;
        }
        if (PREDICT_FALSE(literal_length >= 61)) {
          // Long literal.
          const size_t literal_length_length = literal_length - 60;
          literal_length =
              (LittleEndian::Load32(ip) & wordmask[literal_length_length]) + 1;
          ip += literal_length_length;
        }

        size_t avail = ip_limit_ - ip;
        while (avail < literal_length) {
          if (!writer->Append(ip, avail)) return;
          literal_length -= avail;
          reader_->Skip(peeked_);
          size_t n;
          ip = reader_->Peek(&n);
          avail = n;
          peeked_ = avail;
          if (avail == 0) return;  // Premature end of input
          ip_limit_ = ip + avail;
        }
        if (!writer->Append(ip, literal_length)) {
          return;
        }
        ip += literal_length;
        MAYBE_REFILL();
      } else {
        const uint32 entry = char_table[c];
        const uint32 trailer = LittleEndian::Load32(ip) & wordmask[entry >> 11];
        const uint32 length = entry & 0xff;
        ip += entry >> 11;

        // copy_offset/256 is encoded in bits 8..10.  By just fetching
        // those bits, we get copy_offset (since the bit-field starts at
        // bit 8).
        const uint32 copy_offset = entry & 0x700;
        if (!writer->AppendFromSelf(copy_offset + trailer, length)) {
          return;
        }
        MAYBE_REFILL();
      }
    }

#undef MAYBE_REFILL
  }